

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.cpp
# Opt level: O0

void __thiscall
Nova::Grid_Iterator_Cell<float,_1>::Grid_Iterator_Cell
          (Grid_Iterator_Cell<float,_1> *this,Grid<float,_1> *grid_input,int number_of_ghost_cells,
          T_Region *region_type,int side)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  bool local_51;
  int local_4c;
  int axis_3;
  int axis_2;
  T_INDEX max_copy;
  int axis_1;
  int axis;
  Range<int,_1> domain_copy;
  Range<int,_1> domain;
  int side_local;
  T_Region *region_type_local;
  int number_of_ghost_cells_local;
  Grid<float,_1> *grid_input_local;
  Grid_Iterator_Cell<float,_1> *this_local;
  
  Grid_Iterator<float,_1>::Grid_Iterator(&this->super_Grid_Iterator<float,_1>,grid_input);
  local_51 = 2 < (uint)side;
  if (local_51) {
    __assert_fail("side>=0 && side<=2*d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xe,
                  "Nova::Grid_Iterator_Cell<float, 1>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 1]"
                 );
  }
  bVar4 = false;
  if (*region_type != Boundary_Region) {
    bVar4 = *region_type != Interior_Region;
  }
  if (!bVar4) {
    __assert_fail("(region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xf,
                  "Nova::Grid_Iterator_Cell<float, 1>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 1]"
                 );
  }
  Grid<float,_1>::Cell_Indices
            ((Grid<float,_1> *)&domain_copy,(int)(this->super_Grid_Iterator<float,_1>).grid);
  if (*region_type == Whole_Region) {
    if (side != 0) {
      __assert_fail("!side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x14,
                    "Nova::Grid_Iterator_Cell<float, 1>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 1]"
                   );
    }
    Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
  }
  else if (*region_type == Boundary_Interior_Region) {
    if (side == 0) {
      Range<int,_1>::Range((Range<int,_1> *)&axis_1,&domain_copy);
      for (max_copy._data._M_elems[0] = (T_STORAGE)(_Type)0x0; -1 < (int)max_copy._data._M_elems[0];
          max_copy._data._M_elems[0] = (T_STORAGE)((int)max_copy._data._M_elems[0] + -1)) {
        piVar3 = Vector<int,_1,_true>::operator()
                           (&domain_copy.min_corner,(int)max_copy._data._M_elems[0]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()
                           (&domain_copy.max_corner,(int)max_copy._data._M_elems[0]);
        *piVar3 = iVar2;
        Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
        piVar3 = Vector<int,_1,_true>::operator()
                           ((Vector<int,_1,_true> *)&axis,(int)max_copy._data._M_elems[0]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()
                           (&domain_copy.min_corner,(int)max_copy._data._M_elems[0]);
        *piVar3 = iVar2;
        piVar3 = Vector<int,_1,_true>::operator()
                           (&domain_copy.max_corner,(int)max_copy._data._M_elems[0]);
        *piVar3 = iVar2;
        Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
        piVar3 = Vector<int,_1,_true>::operator()
                           ((Vector<int,_1,_true> *)&axis,(int)max_copy._data._M_elems[0]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()
                           (&domain_copy.max_corner,(int)max_copy._data._M_elems[0]);
        *piVar3 = iVar2 + -1;
        piVar3 = Vector<int,_1,_true>::operator()
                           ((Vector<int,_1,_true> *)&axis_1,(int)max_copy._data._M_elems[0]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()
                           (&domain_copy.min_corner,(int)max_copy._data._M_elems[0]);
        *piVar3 = iVar2 + 1;
      }
    }
    else {
      axis_2 = (side + -1) / 2;
      if ((side & 1U) == 0) {
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,axis_2);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.min_corner,axis_2);
        *piVar3 = iVar2;
      }
      else {
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.min_corner,axis_2);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,axis_2);
        *piVar3 = iVar2;
      }
      Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
    }
  }
  else {
    if (*region_type != Ghost_Region || number_of_ghost_cells < 1) {
      __assert_fail("(region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x2e,
                    "Nova::Grid_Iterator_Cell<float, 1>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 1]"
                   );
    }
    if (side == 0) {
      Vector<int,_1,_true>::Vector((Vector<int,_1,_true> *)&axis_3,&domain_copy.max_corner);
      for (local_4c = 0; -1 < local_4c; local_4c = local_4c + -1) {
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,local_4c);
        *piVar3 = 0;
        Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
        piVar3 = Vector<int,_1,_true>::operator()((Vector<int,_1,_true> *)&axis_3,local_4c);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,local_4c);
        *piVar3 = iVar2;
        piVar3 = Vector<int,_1,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_1>).grid)->counts,local_4c);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.min_corner,local_4c);
        *piVar3 = iVar2 + 1;
        Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
        piVar3 = Vector<int,_1,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_1>).grid)->counts,local_4c);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,local_4c);
        *piVar3 = iVar2;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.min_corner,local_4c);
        *piVar3 = 1;
      }
    }
    else {
      iVar2 = (side + -1) / 2;
      if ((side & 1U) == 0) {
        piVar3 = Vector<int,_1,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_1>).grid)->counts,iVar2);
        iVar1 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.min_corner,iVar2);
        *piVar3 = iVar1 + 1;
      }
      else {
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,iVar2);
        *piVar3 = 0;
      }
      Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
    }
  }
  Grid_Iterator<float,_1>::Reset(&this->super_Grid_Iterator<float,_1>,0);
  return;
}

Assistant:

Grid_Iterator_Cell<T,d>::
Grid_Iterator_Cell(const Grid<T,d>& grid_input,const int number_of_ghost_cells,const T_Region& region_type,const int side)
    :Base(grid_input)
{
    assert(side>=0 && side<=2*d);
    assert((region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region));
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:               assert(!side);
                                                    Add_Region(domain);
                                                    break;

        case Grid<T,d>::Boundary_Interior_Region:   if(!side)
                                                    {
                                                        Range<int,d> domain_copy(domain);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=domain.min_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain.min_corner(axis)=domain_copy.max_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain_copy.max_corner(axis)-1;
                                                            domain.min_corner(axis)=domain_copy.min_corner(axis)+1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=domain.min_corner(axis);
                                                        else domain.min_corner(axis)=domain.max_corner(axis);
                                                        Add_Region(domain);
                                                    }
                                                    break;

        default:                                    assert((region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0));
                                                    if(!side)
                                                    {
                                                        T_INDEX max_copy(domain.max_corner);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=0;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=max_copy(axis);
                                                            domain.min_corner(axis)=grid.counts(axis)+1;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=grid.counts(axis);
                                                            domain.min_corner(axis)=1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=0;
                                                        else domain.min_corner(axis)=grid.counts(axis)+1;
                                                        Add_Region(domain);
                                                    }
                                                    break;
    }
    Reset();
}